

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_f00bc::preprocessor<baryonyx::raw_problem>::init_constraints_length_container
          (preprocessor<baryonyx::raw_problem> *this)

{
  const_iterator cVar1;
  const_iterator cVar2;
  iterator iVar3;
  preprocessor<baryonyx::raw_problem> *this_local;
  
  cVar1 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::cbegin
                    (&this->pb->equal_constraints);
  cVar2 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::cend
                    (&this->pb->equal_constraints);
  iVar3 = std::vector<int,_std::allocator<int>_>::begin(&this->equal_constraints);
  std::
  transform<__gnu_cxx::__normal_iterator<baryonyx::constraint_const*,std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,(anonymous_namespace)::preprocessor<baryonyx::raw_problem>::init_constraints_length_container()::_lambda(auto:1_const&)_1_>
            (cVar1._M_current,cVar2._M_current,iVar3._M_current);
  cVar1 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::cbegin
                    (&this->pb->greater_constraints);
  cVar2 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::cend
                    (&this->pb->greater_constraints);
  iVar3 = std::vector<int,_std::allocator<int>_>::begin(&this->greater_constraints);
  std::
  transform<__gnu_cxx::__normal_iterator<baryonyx::constraint_const*,std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,(anonymous_namespace)::preprocessor<baryonyx::raw_problem>::init_constraints_length_container()::_lambda(auto:1_const&)_2_>
            (cVar1._M_current,cVar2._M_current,iVar3._M_current);
  cVar1 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::cbegin
                    (&this->pb->less_constraints);
  cVar2 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::cend
                    (&this->pb->less_constraints);
  iVar3 = std::vector<int,_std::allocator<int>_>::begin(&this->less_constraints);
  std::
  transform<__gnu_cxx::__normal_iterator<baryonyx::constraint_const*,std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,(anonymous_namespace)::preprocessor<baryonyx::raw_problem>::init_constraints_length_container()::_lambda(auto:1_const&)_3_>
            (cVar1._M_current,cVar2._M_current,iVar3._M_current);
  return;
}

Assistant:

void init_constraints_length_container()
    {
        std::transform(
          pb.equal_constraints.cbegin(),
          pb.equal_constraints.cend(),
          equal_constraints.begin(),
          [](const auto& elem) { return bx::length(elem.elements); });

        std::transform(
          pb.greater_constraints.cbegin(),
          pb.greater_constraints.cend(),
          greater_constraints.begin(),
          [](const auto& elem) { return bx::length(elem.elements); });

        std::transform(
          pb.less_constraints.cbegin(),
          pb.less_constraints.cend(),
          less_constraints.begin(),
          [](const auto& elem) { return bx::length(elem.elements); });
    }